

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

const_iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
          (const_iterator *__return_storage_ptr__,
          StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *this)

{
  int iVar1;
  Endpoint **ppEVar2;
  Endpoint *pEVar3;
  
  iVar1 = this->bsize;
  ppEVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppEVar2 == (Endpoint **)0x0) {
      ppEVar2 = &end::emptyValue;
    }
    else {
      ppEVar2 = ppEVar2 + (long)this->dataSlotIndex + 1;
    }
    pEVar3 = *ppEVar2;
    iVar1 = 0;
  }
  else {
    ppEVar2 = ppEVar2 + this->dataSlotIndex;
    pEVar3 = *ppEVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppEVar2;
  __return_storage_ptr__->ptr = pEVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

const_iterator end() const
        {
            static const X* const emptyValue{nullptr};
            if (bsize == blockSize) {
                const X* const* ptr = (dataptr != nullptr) ?
                    &(dataptr[dataSlotIndex + 1]) :
                    &emptyValue;
                return {ptr, 0};
            }
            const X* const* ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }